

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decoder.hpp
# Opt level: O3

int __thiscall
zmq::decoder_base_t<zmq::v2_decoder_t,_zmq::shared_message_memory_allocator>::decode
          (decoder_base_t<zmq::v2_decoder_t,_zmq::shared_message_memory_allocator> *this,
          uchar *data_,size_t size_,size_t *bytes_used_)

{
  int iVar1;
  code *pcVar2;
  uchar *puVar3;
  ulong uVar4;
  ulong uVar5;
  long *plVar6;
  ulong __n;
  
  *bytes_used_ = 0;
  puVar3 = this->_read_pos;
  if (puVar3 == data_) {
    uVar4 = this->_to_read;
    if (uVar4 < size_) {
      fprintf(_stderr,"Assertion failed: %s (%s:%d)\n","size_ <= _to_read",
              "/workspace/llm4binary/github/license_c_cmakelists/CERT-Polska[P]ursadb/extern/libzmq/src/decoder.hpp"
              ,0x6e);
      fflush(_stderr);
      zmq_abort("size_ <= _to_read");
      puVar3 = this->_read_pos;
      uVar4 = this->_to_read;
    }
    this->_read_pos = puVar3 + size_;
    this->_to_read = uVar4 - size_;
    *bytes_used_ = size_;
    do {
      if (this->_to_read != 0) goto LAB_001a4828;
      pcVar2 = (code *)this->_next;
      plVar6 = (long *)((long)&(this->super_i_decoder)._vptr_i_decoder + *(long *)&this->field_0x10)
      ;
      if (((ulong)pcVar2 & 1) != 0) {
        pcVar2 = *(code **)(pcVar2 + *plVar6 + -1);
      }
      iVar1 = (*pcVar2)(plVar6,data_ + *bytes_used_);
    } while (iVar1 == 0);
  }
  else if (size_ == 0) {
LAB_001a4828:
    iVar1 = 0;
  }
  else {
    uVar4 = this->_to_read;
    uVar5 = 0;
    do {
      __n = size_ - uVar5;
      if (uVar4 <= size_ - uVar5) {
        __n = uVar4;
      }
      puVar3 = this->_read_pos;
      if (puVar3 != data_ + uVar5) {
        memcpy(puVar3,data_ + uVar5,__n);
        puVar3 = this->_read_pos;
        uVar4 = this->_to_read;
      }
      this->_read_pos = puVar3 + __n;
      this->_to_read = uVar4 - __n;
      *bytes_used_ = *bytes_used_ + __n;
      while (uVar4 = this->_to_read, uVar4 == 0) {
        pcVar2 = (code *)this->_next;
        plVar6 = (long *)((long)&(this->super_i_decoder)._vptr_i_decoder +
                         *(long *)&this->field_0x10);
        if (((ulong)pcVar2 & 1) != 0) {
          pcVar2 = *(code **)(pcVar2 + *plVar6 + -1);
        }
        iVar1 = (*pcVar2)(plVar6,data_ + *bytes_used_);
        if (iVar1 != 0) {
          return iVar1;
        }
      }
      uVar5 = *bytes_used_;
      iVar1 = 0;
    } while (uVar5 < size_);
  }
  return iVar1;
}

Assistant:

int decode (const unsigned char *data_,
                std::size_t size_,
                std::size_t &bytes_used_) ZMQ_FINAL
    {
        bytes_used_ = 0;

        //  In case of zero-copy simply adjust the pointers, no copying
        //  is required. Also, run the state machine in case all the data
        //  were processed.
        if (data_ == _read_pos) {
            zmq_assert (size_ <= _to_read);
            _read_pos += size_;
            _to_read -= size_;
            bytes_used_ = size_;

            while (!_to_read) {
                const int rc =
                  (static_cast<T *> (this)->*_next) (data_ + bytes_used_);
                if (rc != 0)
                    return rc;
            }
            return 0;
        }

        while (bytes_used_ < size_) {
            //  Copy the data from buffer to the message.
            const size_t to_copy = std::min (_to_read, size_ - bytes_used_);
            // Only copy when destination address is different from the
            // current address in the buffer.
            if (_read_pos != data_ + bytes_used_) {
                memcpy (_read_pos, data_ + bytes_used_, to_copy);
            }

            _read_pos += to_copy;
            _to_read -= to_copy;
            bytes_used_ += to_copy;
            //  Try to get more space in the message to fill in.
            //  If none is available, return.
            while (_to_read == 0) {
                // pass current address in the buffer
                const int rc =
                  (static_cast<T *> (this)->*_next) (data_ + bytes_used_);
                if (rc != 0)
                    return rc;
            }
        }

        return 0;
    }